

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantFillFunction<unsigned_char>
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  data_ptr_t pdVar1;
  uchar uVar2;
  idx_t iVar3;
  
  pdVar1 = result->data;
  uVar2 = NumericStats::GetMin<unsigned_char>(&(segment->stats).statistics);
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    pdVar1[iVar3 + start_idx] = uVar2;
  }
  return;
}

Assistant:

void ConstantFillFunction(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &nstats = segment.stats.statistics;

	auto data = FlatVector::GetData<T>(result);
	auto constant_value = NumericStats::GetMin<T>(nstats);
	for (idx_t i = 0; i < count; i++) {
		data[start_idx + i] = constant_value;
	}
}